

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O1

size_t aspa_collapse_as_path(uint32_t *as_path,size_t len)

{
  uint32_t *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar7 = len;
  if (len != 0) {
    uVar5 = len;
    if (len != 1) {
      uVar4 = 1;
      do {
        uVar5 = uVar4;
        if (as_path[uVar4 - 1] == as_path[uVar4]) break;
        uVar4 = uVar4 + 1;
        uVar5 = len;
      } while (len != uVar4);
    }
    uVar4 = uVar5;
    if (uVar5 != len) {
      do {
        uVar6 = uVar5 + 1;
        if (uVar5 + 1 < len) {
          uVar6 = len;
        }
        uVar8 = uVar5;
        do {
          uVar5 = uVar6;
          if (uVar6 - 1 == uVar8) break;
          uVar5 = uVar8 + 1;
          puVar1 = as_path + uVar8;
          lVar3 = uVar8 + 1;
          uVar8 = uVar5;
        } while (*puVar1 == as_path[lVar3]);
        sVar7 = uVar4;
        if (uVar5 == len) break;
        as_path[uVar4] = as_path[uVar5];
        uVar4 = uVar4 + 1;
      } while( true );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return sVar7;
}

Assistant:

RTRLIB_EXPORT size_t aspa_collapse_as_path(uint32_t as_path[], size_t len)
{
	if (len == 0)
		return 0;

	size_t i = 1;

	while (i < len && as_path[i - 1] != as_path[i])
		i++;

	if (i == len)
		return len;

	size_t j = i;

	i++;

	while (true) { // equivalent to while (i < len)
		while (i < len && as_path[i - 1] == as_path[i])
			i++;

		if (i == len)
			break;

		as_path[j++] = as_path[i++];
	}

	return j;
}